

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O3

bool __thiscall ELFIO::elfio::load_segments(elfio *this,istream *stream)

{
  pointer *pppsVar1;
  elfio *peVar2;
  iterator __position;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer ppsVar7;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  segment *psVar8;
  ulong uVar9;
  ulong uVar10;
  undefined **ppuVar11;
  ulong uVar12;
  ulong uVar13;
  section *psVar14;
  bool bVar15;
  segment *seg;
  segment *local_80;
  endianess_convertor *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  vector<ELFIO::segment*,std::allocator<ELFIO::segment*>> *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  istream *local_38;
  
  local_38 = stream;
  uVar3 = (*this->header->_vptr_elf_header[9])();
  uVar4 = (*this->header->_vptr_elf_header[0x1c])();
  iVar5 = (*this->header->_vptr_elf_header[0x1e])();
  local_40 = CONCAT44(extraout_var,iVar5);
  if ((short)uVar4 != 0) {
    local_78 = &this->convertor;
    local_58 = (vector<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)&this->segments_;
    uVar9 = 0;
    local_48 = (ulong)(uVar3 & 0xffff);
    bVar15 = false;
    local_50 = (ulong)(uVar4 & 0xffff);
    do {
      uVar3 = (*this->header->_vptr_elf_header[4])();
      if ((char)uVar3 == '\x01') {
        local_80 = (segment *)operator_new(0x68);
        ppuVar11 = &PTR__segment_impl_00112c98;
        local_80->_vptr_segment = (_func_int **)&PTR__segment_impl_00112c98;
        local_80[8]._vptr_segment = (_func_int **)0x0;
        local_80[9]._vptr_segment = (_func_int **)0x0;
        local_80[10]._vptr_segment = (_func_int **)0x0;
        local_80[0xb]._vptr_segment = (_func_int **)local_78;
        psVar8 = local_80 + 7;
        *(undefined1 *)&local_80[0xc]._vptr_segment = 0;
        *(undefined1 (*) [32])(local_80 + 2) = ZEXT432(0) << 0x40;
      }
      else {
        if ((uVar3 & 0xff) != 2) {
          return bVar15;
        }
        local_80 = (segment *)operator_new(0x80);
        ppuVar11 = &PTR__segment_impl_00112b80;
        local_80->_vptr_segment = (_func_int **)&PTR__segment_impl_00112b80;
        local_80[0xb]._vptr_segment = (_func_int **)0x0;
        local_80[0xc]._vptr_segment = (_func_int **)0x0;
        local_80[0xd]._vptr_segment = (_func_int **)0x0;
        local_80[0xe]._vptr_segment = (_func_int **)local_78;
        *(undefined1 *)&local_80[0xf]._vptr_segment = 0;
        *(undefined1 (*) [32])(local_80 + 2) = ZEXT432(0) << 0x40;
        *(undefined1 (*) [32])(local_80 + 5) = ZEXT432(0) << 0x40;
        psVar8 = local_80 + 10;
      }
      psVar8->_vptr_segment = (_func_int **)0x0;
      (*(code *)ppuVar11[0x1a])(local_80,local_38,uVar9 * local_48 + local_40,0);
      local_70 = uVar9;
      (*local_80->_vptr_segment[0x18])(local_80,uVar9 & 0xffff);
      iVar5 = (*local_80->_vptr_segment[0x11])();
      local_60 = CONCAT44(extraout_var_00,iVar5);
      iVar5 = (*local_80->_vptr_segment[0xd])();
      iVar6 = (*local_80->_vptr_segment[9])();
      local_68 = CONCAT44(extraout_var_02,iVar6);
      iVar6 = (*local_80->_vptr_segment[0xf])();
      peVar2 = (this->sections).parent;
      ppsVar7 = (peVar2->sections_).
                super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar9 = (long)(peVar2->sections_).
                    super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppsVar7;
      if ((uVar9 & 0x7fff8) != 0) {
        uVar13 = CONCAT44(extraout_var_01,iVar5) + local_60;
        uVar10 = CONCAT44(extraout_var_03,iVar6) + local_68;
        uVar12 = 0;
        do {
          if (uVar12 < (ulong)((long)uVar9 >> 3)) {
            psVar14 = ppsVar7[uVar12];
          }
          else {
            psVar14 = (section *)0x0;
          }
          uVar3 = (*psVar14->_vptr_section[7])(psVar14);
          if ((uVar3 & 2) == 0) {
            iVar5 = (*psVar14->_vptr_section[0x17])();
            uVar9 = CONCAT44(extraout_var_04,iVar5);
            iVar5 = (*psVar14->_vptr_section[0x13])(psVar14);
            if (((uVar9 < uVar13) && (local_60 <= uVar9)) &&
               (CONCAT44(extraout_var_05,iVar5) + uVar9 <= uVar13)) {
LAB_00106d1a:
              psVar8 = local_80;
              uVar3 = (*psVar14->_vptr_section[2])(psVar14);
              (*psVar8->_vptr_segment[0x13])(psVar8,(ulong)(uVar3 & 0xffff),0);
            }
          }
          else {
            iVar5 = (*psVar14->_vptr_section[0x11])(psVar14);
            uVar9 = CONCAT44(extraout_var_06,iVar5);
            iVar5 = (*psVar14->_vptr_section[0x13])(psVar14);
            if (((uVar9 < uVar10) && (local_68 <= uVar9)) &&
               (CONCAT44(extraout_var_07,iVar5) + uVar9 <= uVar10)) goto LAB_00106d1a;
          }
          peVar2 = (this->sections).parent;
          uVar12 = uVar12 + 1;
          ppsVar7 = (peVar2->sections_).
                    super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar9 = (long)(peVar2->sections_).
                        super__Vector_base<ELFIO::section_*,_std::allocator<ELFIO::section_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppsVar7;
        } while (uVar12 < ((uint)uVar9 >> 3 & 0xffff));
      }
      __position._M_current =
           (this->segments_).super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->segments_).super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ELFIO::segment*,std::allocator<ELFIO::segment*>>::
        _M_realloc_insert<ELFIO::segment*const&>(local_58,__position,&local_80);
      }
      else {
        *__position._M_current = local_80;
        pppsVar1 = &(this->segments_).
                    super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppsVar1 = *pppsVar1 + 1;
      }
      uVar9 = local_70 + 1;
      bVar15 = local_50 <= uVar9;
    } while (uVar9 != local_50);
  }
  return true;
}

Assistant:

bool load_segments( std::istream& stream )
    {
        Elf_Half  entry_size = header->get_segment_entry_size();
        Elf_Half  num        = header->get_segments_num();
        Elf64_Off offset     = header->get_segments_offset();

        for ( Elf_Half i = 0; i < num; ++i ) {
            segment* seg;
            unsigned char file_class = header->get_class();

            if ( file_class == ELFCLASS64 ) {
                seg = new segment_impl<Elf64_Phdr>( &convertor );
            }
            else if ( file_class == ELFCLASS32 ) {
                seg = new segment_impl<Elf32_Phdr>( &convertor );
            }
            else {
                return false;
            }

            seg->load( stream, (std::streamoff)offset + i * entry_size );
            seg->set_index( i );

            // Add sections to the segments (similar to readelfs algorithm)
            Elf64_Off segBaseOffset = seg->get_offset();
            Elf64_Off segEndOffset  = segBaseOffset + seg->get_file_size();
            Elf64_Off segVBaseAddr = seg->get_virtual_address();
            Elf64_Off segVEndAddr  = segVBaseAddr + seg->get_memory_size();
            for( Elf_Half j = 0; j < sections.size(); ++j ) {
                const section* psec = sections[j];

                // SHF_ALLOC sections are matched based on the virtual address
                // otherwise the file offset is matched
                if( psec->get_flags() & SHF_ALLOC
                      ? is_sect_in_seg( psec->get_address(), psec->get_size(), segVBaseAddr,  segVEndAddr )
                      : is_sect_in_seg( psec->get_offset(),  psec->get_size(), segBaseOffset, segEndOffset )) {
                      // Alignment of segment shall not be updated, to preserve original value
                      // It will be re-calculated on saving.
                      seg->add_section_index( psec->get_index(), 0 );
                }
            }

            // Add section into the segments' container
            segments_.push_back( seg );
        }

        return true;
    }